

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O0

void dynamic_api_suite::api_lower_bound(void)

{
  pair<int,_int> *local_b8;
  iterator local_b0;
  key_type local_a4;
  iterator local_a0 [2];
  iterator local_90;
  key_type local_84;
  iterator local_80 [2];
  iterator local_70;
  key_type local_64;
  iterator local_60 [2];
  int local_50 [2];
  value_type local_48;
  undefined1 local_40 [8];
  map_view<int,_int,_18446744073709551615UL,_std::less<int>_> span;
  pair<int,_int> array [4];
  
  local_b8 = (pair<int,_int> *)&span.member;
  do {
    memset(local_b8,0,8);
    vista::pair<int,_int>::pair(local_b8);
    local_b8 = local_b8 + 1;
  } while (local_b8 != array + 3);
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::map_view<4UL,_0>
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
             (value_type (*) [4])&span.member);
  local_50[1] = 0xb;
  local_50[0] = 1;
  vista::pair<int,_int>::pair<int,_int,_0>(&local_48,local_50 + 1,local_50);
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::insert
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,local_48);
  local_64 = 10;
  local_60[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::lower_bound
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
                           &local_64);
  local_70 = vista::span<vista::pair<int,_int>,_18446744073709551615UL>::begin
                       ((span<vista::pair<int,_int>,_18446744073709551615UL> *)local_40);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.lower_bound(10)","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x75,"void dynamic_api_suite::api_lower_bound()",local_60,&local_70);
  local_84 = 0xb;
  local_80[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::lower_bound
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
                           &local_84);
  local_90 = vista::span<vista::pair<int,_int>,_18446744073709551615UL>::begin
                       ((span<vista::pair<int,_int>,_18446744073709551615UL> *)local_40);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.lower_bound(11)","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x76,"void dynamic_api_suite::api_lower_bound()",local_80,&local_90);
  local_a4 = 0xc;
  local_a0[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::lower_bound
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
                           &local_a4);
  local_b0 = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::end
                       ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.lower_bound(12)","span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x77,"void dynamic_api_suite::api_lower_bound()",local_a0,&local_b0);
  return;
}

Assistant:

void api_lower_bound()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    span.insert({ 11, 1 });
    BOOST_TEST_EQ(span.lower_bound(10), span.begin());
    BOOST_TEST_EQ(span.lower_bound(11), span.begin());
    BOOST_TEST_EQ(span.lower_bound(12), span.end());
}